

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_9ead9::ExprComparator::VisitCall(ExprComparator *this,CallExpr e)

{
  bool bVar1;
  int iVar2;
  Kind KVar3;
  Kind KVar4;
  SafeBool SVar5;
  ExprBase e1;
  char *__s2;
  long in_RDI;
  NumericExpr num_arg;
  Expr other_arg;
  Expr arg;
  int i;
  int num_args;
  CallExpr call;
  ExprBase in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar6;
  ExprBase in_stack_ffffffffffffff50;
  ExprBase in_stack_ffffffffffffff60;
  ExprBase in_stack_ffffffffffffff68;
  ExprBase e2;
  ExprBase local_60;
  ExprBase local_58;
  ExprBase local_50;
  int local_44;
  Impl *local_40;
  Function local_38;
  int local_2c;
  undefined8 local_28;
  BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> local_20;
  bool local_1;
  
  local_28 = *(undefined8 *)(in_RDI + 8);
  local_20.super_ExprBase.impl_ =
       (ExprBase)mp::Cast<mp::CallExpr>((Expr)in_stack_ffffffffffffff38.impl_);
  local_2c = mp::CallExpr::num_args((CallExpr *)0x1c2f8d);
  local_38 = mp::CallExpr::function((CallExpr *)in_stack_ffffffffffffff38.impl_);
  local_40 = (Impl *)mp::CallExpr::function((CallExpr *)in_stack_ffffffffffffff38.impl_);
  bVar1 = mp::Function::operator!=(&local_38,(Function)local_40);
  uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    in_stack_ffffffffffffff48 = local_2c;
    iVar2 = mp::CallExpr::num_args((CallExpr *)0x1c2ff8);
    uVar6 = CONCAT13(in_stack_ffffffffffffff48 != iVar2,(int3)uVar6);
  }
  if ((char)((uint)uVar6 >> 0x18) == '\0') {
    for (local_44 = 0; local_44 < local_2c; local_44 = local_44 + 1) {
      local_50.impl_ =
           (Impl *)mp::CallExpr::arg((CallExpr *)in_stack_ffffffffffffff68.impl_,
                                     (int)((ulong)in_stack_ffffffffffffff60.impl_ >> 0x20));
      local_58.impl_ =
           (Impl *)mp::CallExpr::arg((CallExpr *)in_stack_ffffffffffffff68.impl_,
                                     (int)((ulong)in_stack_ffffffffffffff60.impl_ >> 0x20));
      KVar3 = mp::internal::ExprBase::kind((ExprBase *)0x1c3079);
      KVar4 = mp::internal::ExprBase::kind((ExprBase *)0x1c3087);
      if (KVar3 != KVar4) {
        return false;
      }
      local_60.impl_ =
           (Impl *)mp::Cast<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                             ((Expr)in_stack_ffffffffffffff38.impl_);
      SVar5 = mp::internal::ExprBase::operator_cast_to_function_pointer(&local_60);
      if (SVar5 == 0) {
        in_stack_ffffffffffffff60.impl_ = (Impl *)local_50;
        in_stack_ffffffffffffff68.impl_ =
             (Impl *)mp::Cast<mp::StringLiteral>((Expr)in_stack_ffffffffffffff38.impl_);
        in_stack_ffffffffffffff38.impl_ =
             (Impl *)mp::StringLiteral::value((StringLiteral *)0x1c3151);
        in_stack_ffffffffffffff50.impl_ = (Impl *)local_58;
        mp::Cast<mp::StringLiteral>((Expr)in_stack_ffffffffffffff38.impl_);
        __s2 = mp::StringLiteral::value((StringLiteral *)0x1c3178);
        iVar2 = strcmp((char *)in_stack_ffffffffffffff38.impl_,__s2);
        if (iVar2 != 0) {
          return false;
        }
      }
      else {
        mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
        BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                   CONCAT44(uVar6,in_stack_ffffffffffffff48),
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff50.impl_
                   ,KVar3);
        e2.impl_ = (Impl *)local_58;
        e1.impl_ = (Impl *)mp::Cast<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                                     ((Expr)in_stack_ffffffffffffff38.impl_);
        mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
        BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                   CONCAT44(uVar6,in_stack_ffffffffffffff48),
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff50.impl_
                   ,KVar3);
        bVar1 = mp::Equal((Expr)e1.impl_,(Expr)e2.impl_);
        if (!bVar1) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ExprComparator::VisitCall(CallExpr e) {
  CallExpr call = Cast<CallExpr>(expr_);
  int num_args = call.num_args();
  if (call.function() != e.function() || num_args != e.num_args())
    return false;
  for (int i = 0; i < num_args; ++i) {
    Expr arg = call.arg(i), other_arg = e.arg(i);
    if (arg.kind() != other_arg.kind())
      return false;
    if (NumericExpr num_arg = Cast<NumericExpr>(arg)) {
      if (!Equal(num_arg, Cast<NumericExpr>(other_arg)))
        return false;
    } else if (std::strcmp(
            Cast<StringLiteral>(arg).value(),
            Cast<StringLiteral>(other_arg).value()) != 0)
      return false;
  }
  return true;
}